

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall DPolyAction::DPolyAction(DPolyAction *this,int polyNum)

{
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00872fa0;
  this->m_PolyObj = polyNum;
  this->m_Speed = 0.0;
  this->m_Dist = 0.0;
  SetInterpolation(this);
  return;
}

Assistant:

DPolyAction::DPolyAction (int polyNum)
{
	m_PolyObj = polyNum;
	m_Speed = 0;
	m_Dist = 0;
	SetInterpolation ();
}